

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::RegisterTypeParameterizedTestSuite
               (char *test_suite_name,CodeLocation *code_location)

{
  UnitTestImpl *this;
  CodeLocation *this_00;
  CodeLocation *in_RSI;
  char *in_stack_00000068;
  TypeParameterizedTestSuiteRegistry *in_stack_00000070;
  
  this = GetUnitTestImpl();
  this_00 = (CodeLocation *)UnitTestImpl::type_parameterized_test_registry(this);
  CodeLocation::CodeLocation(this_00,in_RSI);
  TypeParameterizedTestSuiteRegistry::RegisterTestSuite
            (in_stack_00000070,in_stack_00000068,(CodeLocation *)test_suite_name);
  CodeLocation::~CodeLocation((CodeLocation *)0x114ee1);
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, code_location);
}